

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazyARA.cpp
# Opt level: O0

void __thiscall LazyARAPlanner::~LazyARAPlanner(LazyARAPlanner *this)

{
  SBPLPlanner *in_RDI;
  LazyARAPlanner *unaff_retaddr;
  CHeap *in_stack_00000020;
  
  in_RDI->_vptr_SBPLPlanner = (_func_int **)&PTR_replan_001db800;
  freeMemory(unaff_retaddr);
  std::vector<PlannerStats,_std::allocator<PlannerStats>_>::~vector
            ((vector<PlannerStats,_std::allocator<PlannerStats>_> *)unaff_retaddr);
  std::vector<LazyARAState_*,_std::allocator<LazyARAState_*>_>::~vector
            ((vector<LazyARAState_*,_std::allocator<LazyARAState_*>_> *)unaff_retaddr);
  std::vector<LazyARAState_*,_std::allocator<LazyARAState_*>_>::~vector
            ((vector<LazyARAState_*,_std::allocator<LazyARAState_*>_> *)unaff_retaddr);
  CHeap::~CHeap(in_stack_00000020);
  SBPLPlanner::~SBPLPlanner(in_RDI);
  return;
}

Assistant:

LazyARAPlanner::~LazyARAPlanner()
{
    freeMemory();
}